

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenTypePointer_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,Type *type)

{
  BaseType BVar1;
  StructDef *def;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  Type local_58;
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  KotlinKMPGenerator *this_local;
  
  BVar1 = type->base_type;
  local_20 = type;
  type_local = (Type *)this;
  this_local = (KotlinKMPGenerator *)__return_storage_ptr__;
  if (BVar1 == BASE_TYPE_STRING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"String",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else if (BVar1 == BASE_TYPE_VECTOR) {
    Type::VectorType(&local_58,type);
    GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&local_58);
  }
  else if (BVar1 == BASE_TYPE_STRUCT) {
    def = type->struct_def;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    TypeInNameSpace(__return_storage_ptr__,this,&def->super_Definition,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Table",&local_7a);
    std::allocator<char>::~allocator(&local_7a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypePointer(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenTypeGet(type.VectorType());
      case BASE_TYPE_STRUCT: return TypeInNameSpace(*type.struct_def);
      default: return "Table";
    }
  }